

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

string * __thiscall
google::protobuf::Message::Utf8DebugString_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  Printer printer;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TextFormat::Printer::Printer(&printer);
  TextFormat::Printer::SetUseUtf8StringEscaping(&printer,true);
  printer.expand_any_ = true;
  TextFormat::Printer::PrintToString(&printer,this,__return_storage_ptr__);
  TextFormat::Printer::~Printer(&printer);
  return __return_storage_ptr__;
}

Assistant:

string Message::Utf8DebugString() const {
  string debug_string;

  TextFormat::Printer printer;
  printer.SetUseUtf8StringEscaping(true);
  printer.SetExpandAny(true);

  printer.PrintToString(*this, &debug_string);

  return debug_string;
}